

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiInAlsa::openVirtualPort(MidiInAlsa *this,string *portName)

{
  undefined8 *puVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pthread_t __thread1;
  pthread_t __thread2;
  char *pcVar4;
  size_type sVar5;
  _Alloc_hider _Var6;
  int iVar7;
  undefined4 uVar8;
  long lVar9;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  pthread_attr_t attr;
  long local_60;
  string local_50;
  
  __s = local_a8;
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  if (*(int *)((long)puVar1 + 0xc) < 0) {
    uStack_b0 = 0x10dfd9;
    lVar9 = snd_seq_port_info_sizeof();
    lVar9 = -(lVar9 + 0xfU & 0xfffffffffffffff0);
    __s = local_a8 + lVar9;
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10dfef;
    __n = snd_seq_port_info_sizeof();
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10dffc;
    memset(__s,0,__n);
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e009;
    snd_seq_port_info_set_capability(__s,0x42);
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e016;
    snd_seq_port_info_set_type(__s,0x100002);
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e023;
    snd_seq_port_info_set_midi_channels(__s,0x10);
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e030;
    snd_seq_port_info_set_timestamping(__s,1);
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e03d;
    snd_seq_port_info_set_timestamp_real(__s,1);
    uVar8 = *(undefined4 *)(puVar1 + 9);
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e049;
    snd_seq_port_info_set_timestamp_queue(__s,uVar8);
    pcVar2 = (portName->_M_dataplus)._M_p;
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e054;
    snd_seq_port_info_set_name(__s,pcVar2);
    uVar3 = *puVar1;
    *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e060;
    iVar7 = snd_seq_create_port(uVar3);
    *(int *)((long)puVar1 + 0xc) = iVar7;
    if (iVar7 < 0) {
      pcVar4 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
      *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e095;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar4,0x110cd6);
      pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
      sVar5 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
      attr._48_8_ = &stack0xffffffffffffffa0;
      *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e0b5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(attr.__size + 0x30),pcVar2,pcVar2 + sVar5);
      *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e0c5;
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,(string *)(attr.__size + 0x30));
      uVar3 = attr._48_8_;
      if ((long *)attr._48_8_ != &stack0xffffffffffffffa0) {
        *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e0da;
        operator_delete((void *)uVar3,local_60 + 1);
      }
    }
    else {
      *(undefined8 *)(local_a8 + lVar9 + -8) = 0x10e073;
      uVar8 = snd_seq_port_info_get_port(__s);
      *(undefined4 *)((long)puVar1 + 0xc) = uVar8;
    }
    if (iVar7 < 0) {
      return;
    }
  }
  if ((this->super_MidiInApi).inputData_.doInput == false) {
    __thread1 = puVar1[6];
    __thread2 = puVar1[7];
    *(undefined8 *)(__s + -8) = 0x10e10f;
    iVar7 = pthread_equal(__thread1,__thread2);
    if (iVar7 == 0) {
      *(undefined8 *)(__s + -8) = 0x10e11d;
      pthread_join(__thread1,(void **)0x0);
    }
    uVar3 = *puVar1;
    uVar8 = *(undefined4 *)(puVar1 + 9);
    *(undefined8 *)(__s + -8) = 0x10e134;
    snd_seq_control_queue(uVar3,uVar8,0x1e,0,0);
    uVar3 = *puVar1;
    *(undefined8 *)(__s + -8) = 0x10e13d;
    snd_seq_drain_output(uVar3);
    *(undefined8 *)(__s + -8) = 0x10e14c;
    pthread_attr_init((pthread_attr_t *)local_a8);
    *(undefined8 *)(__s + -8) = 0x10e156;
    pthread_attr_setdetachstate((pthread_attr_t *)local_a8,0);
    *(undefined8 *)(__s + -8) = 0x10e160;
    pthread_attr_setschedpolicy((pthread_attr_t *)local_a8,0);
    (this->super_MidiInApi).inputData_.doInput = true;
    *(undefined8 *)(__s + -8) = 0x10e17c;
    iVar7 = pthread_create(puVar1 + 6,(pthread_attr_t *)local_a8,alsaMidiHandler,
                           &(this->super_MidiInApi).inputData_);
    *(undefined8 *)(__s + -8) = 0x10e187;
    pthread_attr_destroy((pthread_attr_t *)local_a8);
    if (iVar7 != 0) {
      if (puVar1[2] != 0) {
        uVar3 = *puVar1;
        *(undefined8 *)(__s + -8) = 0x10e1a2;
        snd_seq_unsubscribe_port(uVar3);
        uVar3 = puVar1[2];
        *(undefined8 *)(__s + -8) = 0x10e1ab;
        snd_seq_port_subscribe_free(uVar3);
        puVar1[2] = 0;
      }
      (this->super_MidiInApi).inputData_.doInput = false;
      pcVar4 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
      *(undefined8 *)(__s + -8) = 0x10e1d6;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar4,0x110c9e);
      pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
      sVar5 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      *(undefined8 *)(__s + -8) = 0x10e1f5;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar5);
      *(undefined8 *)(__s + -8) = 0x10e205;
      MidiApi::error((MidiApi *)this,THREAD_ERROR,&local_50);
      _Var6._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        *(undefined8 *)(__s + -8) = 0x10e21e;
        operator_delete(_Var6._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void MidiInAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    snd_seq_port_info_t *pinfo;
    snd_seq_port_info_alloca( &pinfo );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels( pinfo, 16 );
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo, portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  if ( inputData_.doInput == false ) {
    // Wait for old thread to stop, if still running
    if ( !pthread_equal( data->thread, data->dummy_thread_id ) )
      pthread_join( data->thread, NULL );

    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      if ( data->subscription ) {
        snd_seq_unsubscribe_port( data->seq, data->subscription );
        snd_seq_port_subscribe_free( data->subscription );
        data->subscription = 0;
      }
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }
}